

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::transposeTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *inputIndices,int *resultIndices,int matrixCount)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float **ppfVar4;
  ulong uVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  
  if (0 < matrixCount) {
    ppfVar4 = this->gTransitionMatrices;
    uVar1 = this->kStateCount;
    iVar2 = this->kCategoryCount;
    iVar6 = this->kTransPaddedStateCount * uVar1;
    uVar11 = 0;
    do {
      if (inputIndices[uVar11] == resultIndices[uVar11]) {
        return -5;
      }
      if (0 < iVar2) {
        pfVar7 = ppfVar4[resultIndices[uVar11]];
        pfVar14 = ppfVar4[inputIndices[uVar11]];
        iVar9 = 0;
        do {
          if (0 < (int)uVar1) {
            iVar3 = this->kTransPaddedStateCount;
            uVar5 = 0;
            pfVar8 = pfVar7;
            pfVar12 = pfVar14;
            do {
              uVar10 = 0;
              pfVar13 = pfVar8;
              do {
                *pfVar13 = pfVar12[uVar10];
                uVar10 = uVar10 + 1;
                pfVar13 = pfVar13 + iVar3;
              } while (uVar1 != uVar10);
              uVar5 = uVar5 + 1;
              pfVar8 = pfVar8 + 1;
              pfVar12 = pfVar12 + iVar3;
            } while (uVar5 != uVar1);
          }
          iVar9 = iVar9 + 1;
          pfVar7 = pfVar7 + iVar6;
          pfVar14 = pfVar14 + iVar6;
        } while (iVar9 != iVar2);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)matrixCount);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::transposeTransitionMatrices(
        const int* inputIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if (inputIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place transpose is not allowed.\n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }

        REALTYPE* A = gTransitionMatrices[inputIndices[u]];
        REALTYPE* C = gTransitionMatrices[resultIndices[u]];

        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    C[kTransPaddedStateCount * j + i] = A[kTransPaddedStateCount * i + j];

                }
            }

            A += kStateCount * kTransPaddedStateCount;
            C += kStateCount * kTransPaddedStateCount;
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    return returnCode;
}